

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O3

void __thiscall Gb_Apu::write_register(Gb_Apu *this,blip_time_t time,uint addr,int data)

{
  Synth *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Gb_Osc *pGVar4;
  Blip_Buffer *pBVar5;
  Blip_Buffer *pBVar6;
  uint uVar7;
  uint uVar8;
  int i_1;
  byte bVar9;
  uint i_2;
  int i;
  long lVar10;
  
  uVar8 = addr - 0xff10;
  if (uVar8 < 0x30) {
    run_until(this,time);
    bVar1 = this->regs[uVar8];
    bVar9 = (byte)data;
    this->regs[uVar8] = bVar9;
    if (addr < 0xff24) {
      write_osc(this,(uVar8 & 0xff) / 5,uVar8,data);
      return;
    }
    if ((addr == 0xff24) && ((uint)bVar1 != data)) {
      this_00 = &this->other_synth;
      lVar10 = 0;
      do {
        pGVar4 = this->oscs[lVar10];
        iVar3 = pGVar4->last_amp;
        pGVar4->last_amp = 0;
        if (((iVar3 != 0) && (pGVar4->enabled != 0)) && (pGVar4->output != (Blip_Buffer *)0x0)) {
          Blip_Synth<8,_1>::offset(this_00,time,-iVar3,pGVar4->output);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      pBVar5 = (this->wave).super_Gb_Osc.outputs[3];
      if (pBVar5 != (Blip_Buffer *)0x0) {
        Blip_Synth<8,_1>::offset(this_00,time,0x1e,pBVar5);
      }
      update_volume(this);
      pBVar5 = (this->wave).super_Gb_Osc.outputs[3];
      if (pBVar5 != (Blip_Buffer *)0x0) {
        Blip_Synth<8,_1>::offset(this_00,time,-0x1e,pBVar5);
        return;
      }
    }
    else if (addr - 0xff25 < 2) {
      uVar8 = (uint)((char)this->regs[0x16] >> 7);
      bVar2 = this->regs[0x15];
      lVar10 = 0;
      do {
        pGVar4 = this->oscs[lVar10];
        pGVar4->enabled = pGVar4->enabled & uVar8;
        uVar7 = (bVar2 & uVar8) >> ((byte)lVar10 & 0x1f);
        pBVar5 = pGVar4->output;
        uVar7 = uVar7 & 1 | uVar7 >> 3 & 2;
        pGVar4->output_select = uVar7;
        pBVar6 = pGVar4->outputs[uVar7];
        pGVar4->output = pBVar6;
        if (pBVar6 != pBVar5) {
          iVar3 = pGVar4->last_amp;
          pGVar4->last_amp = 0;
          if (pBVar5 != (Blip_Buffer *)0x0 && iVar3 != 0) {
            Blip_Synth<8,_1>::offset(&this->other_synth,time,-iVar3,pBVar5);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      if (((-1 < (char)bVar9) && (addr == 0xff26)) && ((uint)bVar1 != data)) {
        lVar10 = 0;
        do {
          if (lVar10 != 0x16) {
            write_register(this,time,(int)lVar10 + 0xff10,(uint)powerup_regs[lVar10]);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x20);
      }
    }
    else if (0xff2f < addr) {
      (this->wave).wave[(ulong)(addr & 0xf) * 2] = (uint8_t)((uint)data >> 4);
      *(byte *)((long)(this->noise).super_Gb_Env.super_Gb_Osc.outputs +
               (ulong)(addr & 0xf) * 2 + -0x23) = bVar9 & 0xf;
    }
  }
  return;
}

Assistant:

void Gb_Apu::write_register( blip_time_t time, unsigned addr, int data )
{
	require( (unsigned) data < 0x100 );
	
	int reg = addr - start_addr;
	if ( (unsigned) reg >= register_count )
		return;
	
	run_until( time );
	
	int old_reg = regs [reg];
	regs [reg] = data;
	
	if ( addr < vol_reg )
	{
		write_osc( reg / 5, reg, data );
	}
	else if ( addr == vol_reg && data != old_reg ) // global volume
	{
		// return all oscs to 0
		for ( int i = 0; i < osc_count; i++ )
		{
			Gb_Osc& osc = *oscs [i];
			int amp = osc.last_amp;
			osc.last_amp = 0;
			if ( amp && osc.enabled && osc.output )
				other_synth.offset( time, -amp, osc.output );
		}
		
		if ( wave.outputs [3] )
			other_synth.offset( time, 30, wave.outputs [3] );
		
		update_volume();
		
		if ( wave.outputs [3] )
			other_synth.offset( time, -30, wave.outputs [3] );
		
		// oscs will update with new amplitude when next run
	}
	else if ( addr == 0xFF25 || addr == status_reg )
	{
		int mask = (regs [status_reg - start_addr] & 0x80) ? ~0 : 0;
		int flags = regs [0xFF25 - start_addr] & mask;
		
		// left/right assignments
		for ( int i = 0; i < osc_count; i++ )
		{
			Gb_Osc& osc = *oscs [i];
			osc.enabled &= mask;
			int bits = flags >> i;
			Blip_Buffer* old_output = osc.output;
			osc.output_select = (bits >> 3 & 2) | (bits & 1);
			osc.output = osc.outputs [osc.output_select];
			if ( osc.output != old_output )
			{
				int amp = osc.last_amp;
				osc.last_amp = 0;
				if ( amp && old_output )
					other_synth.offset( time, -amp, old_output );
			}
		}
		
		if ( addr == status_reg && data != old_reg )
		{
			if ( !(data & 0x80) )
			{
				for ( unsigned i = 0; i < sizeof powerup_regs; i++ )
				{
					if ( i != status_reg - start_addr )
						write_register( time, i + start_addr, powerup_regs [i] );
				}
			}
			else
			{
				//debug_printf( "APU powered on\n" );
			}
		}
	}
	else if ( addr >= 0xFF30 )
	{
		int index = (addr & 0x0F) * 2;
		wave.wave [index] = data >> 4;
		wave.wave [index + 1] = data & 0x0F;
	}
}